

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O0

void __thiscall
amrex::GpuBndryFuncFab<PeleLMdummyFill>::operator()
          (GpuBndryFuncFab<PeleLMdummyFill> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  Box *in_RSI;
  Real in_stack_00000718;
  Geometry *in_stack_00000720;
  int in_stack_00000728;
  int in_stack_0000072c;
  FArrayBox *in_stack_00000730;
  Box *in_stack_00000738;
  GpuBndryFuncFab<PeleLMdummyFill> *in_stack_00000740;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000990;
  int in_stack_00000998;
  int in_stack_000009a0;
  Real in_stack_00001158;
  Geometry *in_stack_00001160;
  int in_stack_00001168;
  int in_stack_0000116c;
  FArrayBox *in_stack_00001170;
  Box *in_stack_00001178;
  GpuBndryFuncFab<PeleLMdummyFill> *in_stack_00001180;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00004a80;
  int in_stack_00004a88;
  int in_stack_00004a90;
  FilfcFace *in_stack_00004a98;
  uint local_54 [2];
  uint local_4c [9];
  Box *local_28;
  uint *local_18;
  uint *local_10;
  
  local_28 = in_RSI;
  local_4c[0] = (uint)Box::ixType(in_RSI);
  local_18 = local_4c;
  if (local_4c[0] == 0) {
    ccfcdoit<amrex::FilccCell>
              (in_stack_00001180,in_stack_00001178,in_stack_00001170,in_stack_0000116c,
               in_stack_00001168,in_stack_00001160,in_stack_00001158,in_stack_00004a80,
               in_stack_00004a88,in_stack_00004a90,(FilccCell *)in_stack_00004a98);
  }
  else {
    local_54[0] = (uint)Box::ixType(local_28);
    local_10 = local_54;
    if (local_54[0] == 7) {
      nddoit(in_stack_00000740,in_stack_00000738,in_stack_00000730,in_stack_0000072c,
             in_stack_00000728,in_stack_00000720,in_stack_00000718,in_stack_00000990,
             in_stack_00000998,in_stack_000009a0);
    }
    else {
      ccfcdoit<amrex::FilfcFace>
                (in_stack_00001180,in_stack_00001178,in_stack_00001170,in_stack_0000116c,
                 in_stack_00001168,in_stack_00001160,in_stack_00001158,in_stack_00004a80,
                 in_stack_00004a88,in_stack_00004a90,in_stack_00004a98);
    }
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::operator() (Box const& bx, FArrayBox& dest,
                                const int dcomp, const int numcomp,
                                Geometry const& geom, const Real time,
                                const Vector<BCRec>& bcr, const int bcomp,
                                const int orig_comp)
{
#if defined(__CUDACC__) && (__CUDACC_VER_MAJOR__ == 11) && (__CUDACC_VER_MINOR__ == 6)
    // The compiler is allowed to always reject static_assert(false,..) even
    // without instantiating this function.  The following is to work around
    // the issue.  Now the compiler is not allowed to reject the code unless
    // GpuBndryFuncFab::operator() is instantiated.
    static_assert(std::is_same<F,int>::value,
                  "CUDA 11.6 bug: https://github.com/AMReX-Codes/amrex/issues/2607");
#endif
    if (bx.ixType().cellCentered()) {
        ccfcdoit(bx,dest,dcomp,numcomp,geom,time,bcr,bcomp,orig_comp, FilccCell{});
    } else if (bx.ixType().nodeCentered()) {
        nddoit(bx,dest,dcomp,numcomp,geom,time,bcr,bcomp,orig_comp);
    } else {
        ccfcdoit(bx,dest,dcomp,numcomp,geom,time,bcr,bcomp,orig_comp, FilfcFace{});
    }
}